

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O0

int __thiscall
rlib::sequencer::MmlCompiler::EventNote::clone
          (EventNote *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<rlib::sequencer::MmlCompiler::EventNote> *in_stack_ffffffffffffffc8;
  EventNote *this_00;
  
  this_00 = this;
  std::
  make_shared<rlib::sequencer::MmlCompiler::EventNote,rlib::sequencer::MmlCompiler::EventNote_const&>
            (this);
  std::shared_ptr<rlib::sequencer::MmlCompiler::Event>::
  shared_ptr<rlib::sequencer::MmlCompiler::EventNote,void>
            ((shared_ptr<rlib::sequencer::MmlCompiler::Event> *)this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<rlib::sequencer::MmlCompiler::EventNote>::~shared_ptr
            ((shared_ptr<rlib::sequencer::MmlCompiler::EventNote> *)0x196493);
  return (int)this;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventNote>(*this);
			}